

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_model(V *values,int num_keys,LinearModel<int> *model,bool use_sampling)

{
  byte in_CL;
  int in_ESI;
  int i;
  LinearModelBuilder<int> builder;
  LinearModel<int> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar1;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LinearModelBuilder<int> *in_stack_ffffffffffffff90;
  
  if ((in_CL & 1) == 0) {
    LinearModelBuilder<int>::LinearModelBuilder
              ((LinearModelBuilder<int> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      LinearModelBuilder<int>::add
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    }
    LinearModelBuilder<int>::build((LinearModelBuilder<int> *)&stack0xffffffffffffff68);
  }
  else {
    build_model_sampling
              (builder.y_sum_._0_8_,builder._28_4_,builder.x_sum_._0_8_,(bool)builder._15_1_);
  }
  return;
}

Assistant:

static void build_model(const V* values, int num_keys, LinearModel<T>* model,
                          bool use_sampling = false) {
    if (use_sampling) {
      build_model_sampling(values, num_keys, model);
      return;
    }

    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i++) {
      builder.add(values[i].first, i);
    }
    builder.build();
  }